

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

void calc_sad3_update_bestmv
               (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,MV_COST_PARAMS *mv_cost_params,
               FULLPEL_MV *best_mv,FULLPEL_MV center_mv,uint8_t *center_address,uint *bestsad,
               uint *raw_bestsad,int search_step,int *best_site,int *chkpts_indices,int *cost_list)

{
  uint uVar1;
  buf_2d *pbVar2;
  search_site_config *psVar3;
  int j_1;
  long lVar4;
  ushort uVar5;
  FULLPEL_MV FVar6;
  short sVar7;
  short sVar8;
  ushort uVar9;
  short sVar10;
  ushort uVar11;
  uint uVar12;
  short local_74;
  uint local_68 [4];
  uint8_t *local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  
  pbVar2 = (ms_params->ms_buffers).src;
  psVar3 = ms_params->search_sites;
  local_58 = center_address + psVar3->site[(uint)search_step][*chkpts_indices].offset;
  local_50 = center_address + psVar3->site[(uint)search_step][chkpts_indices[1]].offset;
  local_48 = center_address + psVar3->site[(uint)search_step][chkpts_indices[2]].offset;
  local_40 = center_address;
  (*ms_params->sdx3df)
            (pbVar2->buf,pbVar2->stride,&local_58,((ms_params->ms_buffers).ref)->stride,local_68);
  lVar4 = 0;
  do {
    uVar1 = local_68[lVar4];
    if (uVar1 < *bestsad) {
      sVar7 = psVar3->site[(uint)search_step][chkpts_indices[lVar4]].mv.row + center_mv.row;
      local_74 = center_mv.col;
      local_74 = psVar3->site[(uint)search_step][chkpts_indices[lVar4]].mv.col + local_74;
      if (mv_cost_params->mv_cost_type < 4) {
        sVar10 = sVar7 - (mv_cost_params->full_ref_mv).row;
        sVar8 = local_74 - (mv_cost_params->full_ref_mv).col;
        uVar11 = sVar10 * 8;
        uVar9 = sVar8 * 8;
        switch(mv_cost_params->mv_cost_type) {
        case '\0':
          uVar12 = (mv_cost_params->mvcost[0][(short)uVar11] +
                    *(int *)((long)mv_cost_params->mvjcost +
                            (ulong)((uint)(uVar9 != 0) * 4 + (uint)(uVar11 != 0) * 8)) +
                   mv_cost_params->mvcost[1][(short)uVar9]) * mv_cost_params->sad_per_bit + 0x100U
                   >> 9;
          break;
        case '\x01':
          uVar5 = sVar10 * -8;
          if ((short)(sVar10 * -8) < 0) {
            uVar5 = uVar11;
          }
          uVar11 = sVar8 * -8;
          if ((short)(sVar8 * -8) < 0) {
            uVar11 = uVar9;
          }
          uVar12 = ((uint)uVar11 + (uint)uVar5) * 4;
          break;
        case '\x02':
          uVar5 = sVar10 * -8;
          if ((short)(sVar10 * -8) < 0) {
            uVar5 = uVar11;
          }
          uVar11 = sVar8 * -8;
          if ((short)(sVar8 * -8) < 0) {
            uVar11 = uVar9;
          }
          uVar12 = ((uint)uVar11 + (uint)uVar5) * 0xf >> 3;
          break;
        case '\x03':
          uVar5 = sVar10 * -8;
          if ((short)(sVar10 * -8) < 0) {
            uVar5 = uVar11;
          }
          uVar11 = sVar8 * -8;
          if ((short)(sVar8 * -8) < 0) {
            uVar11 = uVar9;
          }
          uVar12 = (uint)uVar11 + (uint)uVar5;
        }
      }
      else {
        uVar12 = 0;
      }
      if (uVar12 + uVar1 < *bestsad) {
        if (raw_bestsad != (uint *)0x0) {
          *raw_bestsad = uVar1;
        }
        *bestsad = uVar12 + uVar1;
        FVar6.col = local_74;
        FVar6.row = sVar7;
        *best_mv = FVar6;
        *best_site = (int)lVar4;
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  if (cost_list != (int *)0x0) {
    lVar4 = 0;
    do {
      cost_list[(long)chkpts_indices[lVar4] + 1] = local_68[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
  }
  return;
}

Assistant:

static inline void calc_sad3_update_bestmv(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
    const MV_COST_PARAMS *mv_cost_params, FULLPEL_MV *best_mv,
    FULLPEL_MV center_mv, const uint8_t *center_address, unsigned int *bestsad,
    unsigned int *raw_bestsad, int search_step, int *best_site,
    const int *chkpts_indices, int *cost_list) {
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site *site = ms_params->search_sites->site[search_step];
  unsigned char const *block_offset[4] = {
    center_address + site[chkpts_indices[0]].offset,
    center_address + site[chkpts_indices[1]].offset,
    center_address + site[chkpts_indices[2]].offset,
    center_address,
  };
  unsigned int sads[4];
  ms_params->sdx3df(src->buf, src->stride, block_offset, ref->stride, sads);
  for (int j = 0; j < 3; j++) {
    const int index = chkpts_indices[j];
    const FULLPEL_MV this_mv = { center_mv.row + site[index].mv.row,
                                 center_mv.col + site[index].mv.col };
    const int found_better_mv = update_mvs_and_sad(
        sads[j], &this_mv, mv_cost_params, bestsad, raw_bestsad, best_mv,
        /*second_best_mv=*/NULL);
    if (found_better_mv) *best_site = j;
  }
  if (cost_list) {
    for (int j = 0; j < 3; j++) {
      int index = chkpts_indices[j];
      cost_list[index + 1] = sads[j];
    }
  }
}